

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<PointeeAdaptor_SubN_Test>::CreateTest
          (TestFactoryImpl<PointeeAdaptor_SubN_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x38);
  PointeeAdaptor_SubN_Test::PointeeAdaptor_SubN_Test((PointeeAdaptor_SubN_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }